

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cpp
# Opt level: O3

int run(char *filename)

{
  program_t *value;
  value_t *pvVar1;
  value_t *pvVar2;
  ostream *poVar3;
  int iVar4;
  source_t source;
  vm_t vm;
  ifstream input;
  source_t local_2c0;
  char *local_2a8;
  long local_2a0;
  char local_298 [16];
  vm_t local_288;
  long local_220 [4];
  int aiStack_200 [122];
  
  deci::vm_t::vm_t(&local_288);
  std::ifstream::ifstream(local_220);
  std::ifstream::open((char *)local_220,(_Ios_Openmode)filename);
  iVar4 = -1;
  if (*(int *)((long)aiStack_200 + *(long *)(local_220[0] + -0x18)) == 0) {
    deci::CompileExpression(&local_2c0,filename,(istream *)local_220,false);
    value = deci::program_t::Create
                      (local_2c0.
                       super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>._M_impl
                       .super__Vector_impl_data._M_start,
                       (long)local_2c0.
                             super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_2c0.
                             super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 4);
    pvVar1 = deci::vm_t::Run(&local_288,(value_t *)value);
    (*(value->super_function_t).super_value_t._vptr_value_t[3])(value);
    pvVar2 = deci::nothing_t::Instance();
    if (pvVar2 != pvVar1) {
      (*pvVar1->_vptr_value_t[4])(&local_2a8,pvVar1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_2a8,local_2a0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_2a8 != local_298) {
        operator_delete(local_2a8);
      }
    }
    (*pvVar1->_vptr_value_t[3])(pvVar1);
    if (local_2c0.super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>._M_impl.
        super__Vector_impl_data._M_start != (command_t *)0x0) {
      operator_delete(local_2c0.
                      super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    iVar4 = 0;
  }
  std::ifstream::~ifstream(local_220);
  deci::vm_t::~vm_t(&local_288);
  return iVar4;
}

Assistant:

int run(const char* filename) {

  deci::vm_t vm;

  std::ifstream input;
  input.open(filename, std::ios::in);

  if (input.good()) {
    deci::program_t::source_t source = deci::CompileExpression(filename, input,false);
    deci::program_t* prog = deci::program_t::Create(source.data(), source.size());
    deci::value_t* result = vm.Run(*prog);
    prog->Delete();

    if (!result->IsNothing())
    {
      std::cout << result->ToText() << std::endl;
    }
    result->Delete();
    return 0;
  }
  return -1;
}